

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int pack_particle_slice(field3d<cellp> *cp,int left,int width,
                       vector<int,_std::allocator<int>_> *particle_numbers,
                       vector<particle,_std::allocator<particle>_> *particles)

{
  vector<int,_std::allocator<int>_> *in_RCX;
  int in_EDX;
  int in_ESI;
  size_t *in_R8;
  int k;
  int j;
  int i;
  size_t p_index;
  size_t pn_index;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar1;
  undefined4 local_38;
  undefined4 local_34;
  size_t *p_index_00;
  vector<particle,_std::allocator<particle>_> *particles_00;
  
  particles_00 = (vector<particle,_std::allocator<particle>_> *)0x0;
  p_index_00 = (size_t *)0x0;
  for (local_34 = in_ESI; local_34 < in_ESI + in_EDX; local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 < ny_global; local_38 = local_38 + 1) {
      for (iVar1 = 0; iVar1 < nz_global; iVar1 = iVar1 + 1) {
        field3d<cellp>::operator[]
                  ((field3d<cellp> *)CONCAT44(iVar1,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffbc);
        pack_cell((cellp *)CONCAT44(in_ESI,in_EDX),in_RCX,in_R8,particles_00,p_index_00);
      }
    }
  }
  return (int)p_index_00;
}

Assistant:

int pack_particle_slice(field3d<cellp> & cp, int left, int width, vector<int> & particle_numbers, vector<particle> & particles) {
    size_t pn_index = 0;
    size_t p_index = 0;

    for (int i=left; i<left+width; i++) {
        for (int j=0;j<ny_global;j++) {
            for (int k=0;k<nz_global;k++) {
                pack_cell(cp[i][j][k], particle_numbers, pn_index, particles, p_index);
            }
        }
    }

    return static_cast<int>(p_index);
}